

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

Result<wallet::SelectionResult> * wallet::ErrorMaxWeightExceeded(void)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Result<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  char *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
             ,"");
  paVar2 = &local_48.field_2;
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
               ,"");
  }
  else {
    local_70 = 
    "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
    ;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_48,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_70);
  }
  puVar1 = (undefined8 *)
           ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10)
  ;
  *(undefined8 **)
   &(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
  if (local_68 == &local_58) {
    *puVar1 = CONCAT71(uStack_57,local_58);
    *(undefined8 *)
     ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
         uStack_50;
  }
  else {
    *(undefined1 **)
     &(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_68;
    *(ulong *)((long)&(in_RDI->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
              0x10) = CONCAT71(uStack_57,local_58);
  }
  *(undefined8 *)
   ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) = local_60
  ;
  puVar1 = (undefined8 *)
           ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30)
  ;
  *(undefined8 **)
   ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
       puVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar2) {
    *puVar1 = CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]
                      );
    *(undefined8 *)
     ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
         local_48.field_2._8_8_;
  }
  else {
    *(pointer *)
     ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
         local_48._M_dataplus._M_p;
    *(ulong *)((long)&(in_RDI->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
              0x30) =
         CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
  }
  *(size_type *)
   ((long)&(in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
       local_48._M_string_length;
  (in_RDI->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_string_length = 0;
  local_58 = 0;
  local_60 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    local_68 = &local_58;
    local_48._M_dataplus._M_p = (pointer)paVar2;
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static util::Result<SelectionResult> ErrorMaxWeightExceeded()
{
    return util::Error{_("The inputs size exceeds the maximum weight. "
                         "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
}